

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

uint __thiscall Js::ScriptContext::GetNextSourceContextId(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Cache *pCVar4;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar5;
  BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar6;
  undefined4 *puVar7;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  int local_14;
  uint nextSourceContextId;
  ScriptContext *this_local;
  
  pCVar4 = Cache(this);
  ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                      ((WriteBarrierPtr *)&pCVar4->sourceContextInfoMap);
  if (*ppBVar5 ==
      (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    pCVar4 = Cache(this);
    ppBVar6 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&pCVar4->dynamicSourceContextInfoMap);
    if (*ppBVar6 ==
        (BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x256,
                                  "(this->Cache()->sourceContextInfoMap || this->Cache()->dynamicSourceContextInfoMap)"
                                  ,
                                  "this->Cache()->sourceContextInfoMap || this->Cache()->dynamicSourceContextInfoMap"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  local_14 = 0;
  pCVar4 = Cache(this);
  ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                      ((WriteBarrierPtr *)&pCVar4->sourceContextInfoMap);
  if (*ppBVar5 !=
      (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    pCVar4 = Cache(this);
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&pCVar4->sourceContextInfoMap);
    local_14 = JsUtil::
               BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Count(this_00);
  }
  pCVar4 = Cache(this);
  ppBVar6 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                      ((WriteBarrierPtr *)&pCVar4->dynamicSourceContextInfoMap);
  if (*ppBVar6 !=
      (BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    pCVar4 = Cache(this);
    this_01 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&pCVar4->dynamicSourceContextInfoMap);
    iVar3 = JsUtil::
            BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(this_01);
    local_14 = iVar3 + local_14;
  }
  return local_14 + 1;
}

Assistant:

uint ScriptContext::GetNextSourceContextId()
    {

        Assert(this->Cache()->sourceContextInfoMap ||
            this->Cache()->dynamicSourceContextInfoMap);

        uint nextSourceContextId = 0;

        if (this->Cache()->sourceContextInfoMap)
        {
            nextSourceContextId = this->Cache()->sourceContextInfoMap->Count();
        }

        if (this->Cache()->dynamicSourceContextInfoMap)
        {
            nextSourceContextId += this->Cache()->dynamicSourceContextInfoMap->Count();
        }

        return nextSourceContextId + 1;
    }